

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O0

void * If_ManSatBuildXY(int nLutSize)

{
  int iVar1;
  int iVar2;
  sat_solver *s;
  sat_solver *p;
  int iVarM;
  int m;
  int iVarP1;
  int iVarP0;
  int nVars;
  int nMintsF;
  int nMintsL;
  int nLutSize_local;
  
  iVar1 = 1 << ((byte)nLutSize & 0x1f);
  iVar2 = 1 << ((char)(nLutSize << 1) - 1U & 0x1f);
  s = sat_solver_new();
  sat_solver_setnvars(s,iVar1 * 2 + iVar2);
  for (p._4_4_ = 0; p._4_4_ < iVar2; p._4_4_ = p._4_4_ + 1) {
    sat_solver_add_mux(s,iVar1 * 2 + p._4_4_,p._4_4_ % iVar1,iVar1 + (p._4_4_ / iVar1) * 2 + 1,
                       iVar1 + (p._4_4_ / iVar1) * 2,0,0,0,0);
  }
  return s;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Builds SAT instance for the given structure.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void * If_ManSatBuildXY( int nLutSize )
{
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (2 * nLutSize - 1));
    int nVars   = 2 * nMintsL + nMintsF;
    int iVarP0  = 0;           // LUT0 parameters (total nMintsL)
    int iVarP1  = nMintsL;     // LUT1 parameters (total nMintsL)
    int m,iVarM = 2 * nMintsL; // MUX vars        (total nMintsF)
    sat_solver * p = sat_solver_new();
    sat_solver_setnvars( p, nVars );
    for ( m = 0; m < nMintsF; m++ )
        sat_solver_add_mux( p, 
            iVarM  + m, 
            iVarP0 + m % nMintsL, 
            iVarP1 + 2 * (m / nMintsL) + 1, 
            iVarP1 + 2 * (m / nMintsL), 
            0, 0, 0, 0 );
    return p;
}